

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap_unittest.cc
# Opt level: O2

void __thiscall AddressMapUnittest_Basic_Test::TestBody(AddressMapUnittest_Basic_Test *this)

{
  size_t *res_key;
  long lVar1;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  key;
  size_t sVar2;
  pair<int,_unsigned_long> *ppVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  AssertionResult *pAVar5;
  char *pcVar6;
  char *in_R9;
  int iVar7;
  undefined4 uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  pair<int,_unsigned_long> value;
  pair<int,_unsigned_long> value_00;
  pair<int,_unsigned_long> value_01;
  pair<int,_unsigned_long> value_02;
  FunctionRef<void_(const_void_*,_std::pair<int,_unsigned_long>_*)> body;
  undefined1 local_1498 [8];
  mt19937 rng;
  void *res_p;
  Entry *local_100;
  code *local_f8;
  code *local_f0;
  Object *local_e8;
  ulong local_e0;
  int local_d8;
  int local_d4;
  int N;
  anon_class_8_1_ba1d750b uniform;
  vector<PtrAndSize,_std::allocator<PtrAndSize>_> ptrs_and_sizes;
  int local_a4;
  undefined1 local_a0 [8];
  size_t s;
  undefined8 local_90;
  undefined8 local_88;
  _Base_ptr local_80;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  char *p;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_40;
  AssertHelper local_38;
  
  local_d8 = 100000;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)local_1498,0);
  uniform.rng = (mt19937 *)0x0;
  _N = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)local_1498;
  std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::reserve
            ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)&uniform,100000);
  iVar7 = 100000;
  while (bVar11 = iVar7 != 0, iVar7 = iVar7 + -1, bVar11) {
    sVar2 = TestBody::anon_class_8_1_ba1d750b::operator()((anon_class_8_1_ba1d750b *)&N,0x30);
    local_a0 = (undefined1  [8])(sVar2 + 1);
    res_p = operator_new__((ulong)local_a0);
    std::vector<PtrAndSize,std::allocator<PtrAndSize>>::emplace_back<char*,unsigned_long&>
              ((vector<PtrAndSize,std::allocator<PtrAndSize>> *)&uniform,(char **)&res_p,
               (unsigned_long *)local_a0);
  }
  res_key = &rng._M_p;
  uVar10 = 0;
LAB_00108332:
  if ((int)uVar10 != 0x14) {
    local_d4 = (int)uVar10;
    printf("Iteration %d/%d...\n",uVar10,0x14);
    std::
    shuffle<__gnu_cxx::__normal_iterator<PtrAndSize*,std::vector<PtrAndSize,std::allocator<PtrAndSize>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              ((__normal_iterator<PtrAndSize_*,_std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>_>
                )uniform.rng,
               (__normal_iterator<PtrAndSize_*,_std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>_>
                )0x0,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)local_1498);
    local_100 = (Entry *)0x0;
    local_f8 = malloc;
    local_f0 = free;
    local_e8 = (Object *)calloc(1,0x8008);
    res_p = local_e8 + 1;
    for (local_a4 = 0; local_a4 < 100000; local_a4 = local_a4 + 1) {
      local_70._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (uniform.rng)->_M_x[(long)local_a4 * 2];
      ppVar3 = AddressMap<std::pair<int,_unsigned_long>_>::FindMutable
                         ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,local_70._M_head_impl
                         );
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      local_60[0] = (internal)(ppVar3 == (pair<int,_unsigned_long> *)0x0);
      if (ppVar3 != (pair<int,_unsigned_long> *)0x0) {
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a0,(internal *)local_60,(AssertionResult *)0x12c0ae,"true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x5d,(char *)local_a0);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
        goto LAB_00108e97;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      sVar2 = TestBody::anon_class_8_1_ba1d750b::operator()
                        ((anon_class_8_1_ba1d750b *)&N,(uniform.rng)->_M_x[(long)local_a4 * 2 + 1]);
      ppVar3 = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                         ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,SizeFunc,0x6400000,
                          local_70._M_head_impl + (int)sVar2,(Key *)res_key);
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      local_60[0] = (internal)(ppVar3 == (pair<int,_unsigned_long> *)0x0);
      if (ppVar3 != (pair<int,_unsigned_long> *)0x0) {
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a0,(internal *)local_60,(AssertionResult *)0x12c14f,"true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x5f,(char *)local_a0);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
        goto LAB_00108e97;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      value._0_8_ = (long)local_a4;
      value.second = (uniform.rng)->_M_x[value._0_8_ * 2 + 1];
      AddressMap<std::pair<int,_unsigned_long>_>::Insert
                ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,local_70._M_head_impl,value);
      ppVar3 = AddressMap<std::pair<int,_unsigned_long>_>::FindMutable
                         ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,local_70._M_head_impl
                         );
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      local_60[0] = (internal)(ppVar3 != (pair<int,_unsigned_long> *)0x0);
      if (ppVar3 == (pair<int,_unsigned_long> *)0x0) {
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a0,(internal *)local_60,(AssertionResult *)"result = map.Find(p)"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x61,(char *)local_a0);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
        goto LAB_00108e97;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_a0,"result->first","i",&ppVar3->first,&local_a4);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_60);
        if ((undefined8 *)CONCAT44(s._4_4_,(undefined4)s) == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)CONCAT44(s._4_4_,(undefined4)s);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x62,pcVar6);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)local_60);
        goto LAB_0010903c;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s);
      ppVar3 = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                         ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,SizeFunc,0x31,
                          local_70._M_head_impl + (int)sVar2,(Key *)res_key);
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      local_60[0] = (internal)(ppVar3 != (pair<int,_unsigned_long> *)0x0);
      if (ppVar3 == (pair<int,_unsigned_long> *)0x0) {
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a0,(internal *)local_60,
                   (AssertionResult *)
                   "result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,99,(char *)local_a0);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
        goto LAB_00108e97;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      testing::internal::CmpHelperEQ<void_const*,char*>
                ((internal *)local_a0,"res_p","p",(void **)res_key,(char **)&local_70);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_60);
        if ((undefined8 *)CONCAT44(s._4_4_,(undefined4)s) == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)CONCAT44(s._4_4_,(undefined4)s);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,100,pcVar6);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)local_60);
        goto LAB_0010903c;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_a0,"result->first","i",&ppVar3->first,&local_a4);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_60);
        if ((undefined8 *)CONCAT44(s._4_4_,(undefined4)s) == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)CONCAT44(s._4_4_,(undefined4)s);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x65,pcVar6);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)local_60);
        goto LAB_0010903c;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s);
      value_00.first = local_a4 + 100000;
      value_00._4_4_ = 0;
      value_00.second = (uniform.rng)->_M_x[(long)local_a4 * 2 + 1];
      AddressMap<std::pair<int,_unsigned_long>_>::Insert
                ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,local_70._M_head_impl,value_00
                );
      ppVar3 = AddressMap<std::pair<int,_unsigned_long>_>::FindMutable
                         ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,local_70._M_head_impl
                         );
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      local_60[0] = (internal)(ppVar3 != (pair<int,_unsigned_long> *)0x0);
      if (ppVar3 == (pair<int,_unsigned_long> *)0x0) {
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a0,(internal *)local_60,(AssertionResult *)"result = map.Find(p)"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x67,(char *)local_a0);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
        goto LAB_00108e97;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      local_60._0_4_ = local_a4 + 100000;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_a0,"result->first","i + N",&ppVar3->first,(int *)local_60);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_60);
        if ((undefined8 *)CONCAT44(s._4_4_,(undefined4)s) == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)CONCAT44(s._4_4_,(undefined4)s);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x68,pcVar6);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)local_60);
        goto LAB_0010903c;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s);
    }
    lVar9 = 0;
    for (uVar10 = 0; uVar10 < 100000; uVar10 = uVar10 + 2) {
      local_60 = (undefined1  [8])((ulong)local_60 & 0xffffffff00000000);
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      bVar11 = AddressMap<std::pair<int,_unsigned_long>_>::FindAndRemove
                         ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,
                          *(Key *)((long)(uniform.rng)->_M_x + lVar9),
                          (pair<int,_unsigned_long> *)local_60);
      local_70._M_head_impl._0_1_ = bVar11;
      p = (char *)0x0;
      if (!bVar11) {
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a0,(internal *)&local_70,
                   (AssertionResult *)"map.FindAndRemove(p, &removed)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x6f,(char *)local_a0);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        std::__cxx11::string::~string((string *)local_a0);
        if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
        }
        pAVar5 = (AssertionResult *)&p;
        goto LAB_0010905b;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p);
      local_70._M_head_impl._0_4_ = (int)uVar10 + 100000;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_a0,"removed.first","i + N",(int *)local_60,(int *)&local_70);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        if ((undefined8 *)CONCAT44(s._4_4_,(undefined4)s) == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)CONCAT44(s._4_4_,(undefined4)s);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x70,pcVar6);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        _Var4._M_head_impl = local_70._M_head_impl;
        goto LAB_00109049;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s);
      lVar9 = lVar9 + 0x20;
    }
    ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar10 = 1; uVar10 < 100000; uVar10 = uVar10 + 2) {
      local_70._M_head_impl =
           *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)((uniform.rng)->_M_x + 2) +
            (long)ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      ppVar3 = AddressMap<std::pair<int,_unsigned_long>_>::FindMutable
                         ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,local_70._M_head_impl
                         );
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      local_60[0] = (internal)(ppVar3 != (pair<int,_unsigned_long> *)0x0);
      if (ppVar3 == (pair<int,_unsigned_long> *)0x0) {
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a0,(internal *)local_60,(AssertionResult *)"result = map.Find(p)"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x76,(char *)local_a0);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
        goto LAB_00108e97;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      iVar7 = (int)uVar10 + 100000;
      local_60._0_4_ = iVar7;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_a0,"result->first","i + N",&ppVar3->first,(int *)local_60);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_60);
        if ((undefined8 *)CONCAT44(s._4_4_,(undefined4)s) == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)CONCAT44(s._4_4_,(undefined4)s);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x77,pcVar6);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)local_60);
        goto LAB_0010903c;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s);
      sVar2 = TestBody::anon_class_8_1_ba1d750b::operator()
                        ((anon_class_8_1_ba1d750b *)&N,
                         *(size_t *)
                          ((long)((uniform.rng)->_M_x + 3) +
                          (long)ptrs_and_sizes.
                                super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage));
      ppVar3 = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                         ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,SizeFunc,0x31,
                          local_70._M_head_impl + (int)sVar2,(Key *)res_key);
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      local_60[0] = (internal)(ppVar3 != (pair<int,_unsigned_long> *)0x0);
      if (ppVar3 == (pair<int,_unsigned_long> *)0x0) {
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a0,(internal *)local_60,
                   (AssertionResult *)
                   "result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x79,(char *)local_a0);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
        goto LAB_00108e97;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      testing::internal::CmpHelperEQ<void_const*,char*>
                ((internal *)local_a0,"res_p","p",(void **)res_key,(char **)&local_70);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_60);
        if ((undefined8 *)CONCAT44(s._4_4_,(undefined4)s) == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)CONCAT44(s._4_4_,(undefined4)s);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x7a,pcVar6);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)local_60);
        goto LAB_0010903c;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_a0,"result->first","i + N",&ppVar3->first,(int *)local_60);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_60);
        if ((undefined8 *)CONCAT44(s._4_4_,(undefined4)s) == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)CONCAT44(s._4_4_,(undefined4)s);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x7b,pcVar6);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)local_60);
        goto LAB_0010903c;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s);
      value_01._0_8_ = uVar10 + 200000 & 0xffffffff;
      value_01.second =
           *(unsigned_long *)
            ((long)((uniform.rng)->_M_x + 3) +
            (long)ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      AddressMap<std::pair<int,_unsigned_long>_>::Insert
                ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,local_70._M_head_impl,value_01
                );
      ppVar3 = AddressMap<std::pair<int,_unsigned_long>_>::FindMutable
                         ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,local_70._M_head_impl
                         );
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      local_60[0] = (internal)(ppVar3 != (pair<int,_unsigned_long> *)0x0);
      if (ppVar3 == (pair<int,_unsigned_long> *)0x0) {
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a0,(internal *)local_60,(AssertionResult *)"result = map.Find(p)"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x7d,(char *)local_a0);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
        goto LAB_00108e97;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      local_60._0_4_ = (int)(uVar10 + 200000);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_a0,"result->first","i + 2*N",&ppVar3->first,(int *)local_60);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_60);
        if ((undefined8 *)CONCAT44(s._4_4_,(undefined4)s) == (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)CONCAT44(s._4_4_,(undefined4)s);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x7e,pcVar6);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)local_60);
        goto LAB_0010903c;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&s);
      ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           ptrs_and_sizes.super__Vector_base<PtrAndSize,_std::allocator<PtrAndSize>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2;
    }
    lVar9 = 8;
    uVar10 = 0;
LAB_001088f1:
    if (99999 < uVar10) goto LAB_00108ad2;
    local_70._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
          ((long)(uniform.rng)->_M_x + lVar9 + -8);
    local_e0 = uVar10;
    sVar2 = TestBody::anon_class_8_1_ba1d750b::operator()
                      ((anon_class_8_1_ba1d750b *)&N,*(size_t *)((long)(uniform.rng)->_M_x + lVar9))
    ;
    ppVar3 = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                       ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,SizeFunc,0x6400000,
                        local_70._M_head_impl + (int)sVar2,(Key *)res_key);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    local_60[0] = (internal)(ppVar3 == (pair<int,_unsigned_long> *)0x0);
    if (ppVar3 == (pair<int,_unsigned_long> *)0x0) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      lVar1 = local_e0 + 200000;
      value_02.second = *(unsigned_long *)((long)(uniform.rng)->_M_x + lVar9);
      value_02._0_8_ = lVar1;
      AddressMap<std::pair<int,_unsigned_long>_>::Insert
                ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,local_70._M_head_impl,value_02
                );
      ppVar3 = AddressMap<std::pair<int,_unsigned_long>_>::FindMutable
                         ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,local_70._M_head_impl
                         );
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      local_60[0] = (internal)(ppVar3 != (pair<int,_unsigned_long> *)0x0);
      if (ppVar3 == (pair<int,_unsigned_long> *)0x0) {
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a0,(internal *)local_60,(AssertionResult *)"result = map.Find(p)"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x87,(char *)local_a0);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
        goto LAB_00108e97;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      uVar8 = (undefined4)lVar1;
      local_60._0_4_ = uVar8;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_a0,"result->first","i + 2*N",&ppVar3->first,(int *)local_60);
      if (local_a0[0] != (internal)0x0) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&s);
        ppVar3 = AddressMap<std::pair<int,_unsigned_long>_>::FindInside
                           ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,SizeFunc,0x31,
                            local_70._M_head_impl + (int)sVar2,(Key *)res_key);
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        local_60[0] = (internal)(ppVar3 != (pair<int,_unsigned_long> *)0x0);
        if (ppVar3 == (pair<int,_unsigned_long> *)0x0) {
          testing::Message::Message((Message *)&local_38);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a0,(internal *)local_60,
                     (AssertionResult *)
                     "result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                     ,0x89,(char *)local_a0);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
          goto LAB_00108e97;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_ar_);
        testing::internal::CmpHelperEQ<void_const*,char*>
                  ((internal *)local_a0,"res_p","p",(void **)res_key,(char **)&local_70);
        if (local_a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_60);
          if ((undefined8 *)CONCAT44(s._4_4_,(undefined4)s) == (undefined8 *)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)CONCAT44(s._4_4_,(undefined4)s);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                     ,0x8a,pcVar6);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)local_60);
          goto LAB_0010903c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&s);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_a0,"result->first","i + 2*N",&ppVar3->first,(int *)local_60);
        if (local_a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_60);
          if ((undefined8 *)CONCAT44(s._4_4_,(undefined4)s) == (undefined8 *)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)CONCAT44(s._4_4_,(undefined4)s);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                     ,0x8b,pcVar6);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)local_60);
          goto LAB_0010903c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&s);
        uVar10 = local_e0 + 2;
        lVar9 = lVar9 + 0x20;
        goto LAB_001088f1;
      }
      testing::Message::Message((Message *)local_60);
      if ((undefined8 *)CONCAT44(s._4_4_,(undefined4)s) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT44(s._4_4_,(undefined4)s);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x88,pcVar6);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)local_60);
LAB_0010903c:
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      _Var4._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
LAB_00109049:
      if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )_Var4._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)_Var4._M_head_impl + 8))();
      }
      pAVar5 = (AssertionResult *)&s;
    }
    else {
      testing::Message::Message((Message *)&local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)local_60,
                 (AssertionResult *)"!map.FindInside(&SizeFunc, kMaxSize, p + offs, &res_p)","false"
                 ,"true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                 ,0x85,(char *)local_a0);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
LAB_00108e97:
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      std::__cxx11::string::~string((string *)local_a0);
      if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
      }
      pAVar5 = &gtest_ar_;
    }
LAB_0010905b:
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pAVar5);
    goto LAB_00109060;
  }
LAB_0010906c:
  std::vector<PtrAndSize,_std::allocator<PtrAndSize>_>::~vector
            ((vector<PtrAndSize,_std::allocator<PtrAndSize>_> *)&uniform);
  return;
LAB_00108ad2:
  s._0_4_ = 0;
  local_90 = (_Base_ptr)0x0;
  local_88 = &s;
  local_78 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_60 = (undefined1  [8])local_a0;
  body.data = (internal *)local_60;
  body.fn = tcmalloc::FunctionRef<void(void_const*,std::pair<int,unsigned_long>*)>::
            FunctionRef<AddressMapUnittest_Basic_Test::TestBody()::$_0,void>(AddressMapUnittest_Basic_Test::TestBody()::$_0_const&)
            ::{lambda(void_const*,std::pair<int,unsigned_long>*,void*)#1}::
            pair<int,unsigned_long>__void__;
  local_80 = (_Base_ptr)local_88;
  AddressMap<std::pair<int,_unsigned_long>_>::Iterate
            ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,body);
  local_70._M_head_impl = local_78;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_60,"check_set.size()","N",(unsigned_long *)&local_70,&local_d8);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar_._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
               ,0x93,pcVar6);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_70);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
    iVar7 = 200000;
    for (lVar9 = 0; lVar9 != 1600000; lVar9 = lVar9 + 0x10) {
      key._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           *(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             *)&((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  *)((long)(uniform.rng)->_M_x + lVar9))->
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      gtest_ar_._0_4_ = iVar7;
      local_60 = (undefined1  [8])
                 key._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
      std::
      _Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
      ::erase((_Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
               *)local_a0,(key_type *)local_60);
      ppVar3 = AddressMap<std::pair<int,_unsigned_long>_>::FindMutable
                         ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p,
                          (Key)key._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl);
      p = (char *)0x0;
      local_70._M_head_impl._0_1_ = ppVar3 != (pair<int,_unsigned_long> *)0x0;
      if (ppVar3 == (pair<int,_unsigned_long> *)0x0) {
        testing::Message::Message((Message *)&local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_60,(internal *)&local_70,
                   (AssertionResult *)"result = map.Find(p)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x97,(char *)local_60);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        std::__cxx11::string::~string((string *)local_60);
        if ((long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_38.data_._4_4_,local_38.data_._0_4_) + 8))();
        }
        pAVar5 = (AssertionResult *)&p;
        goto LAB_0010960a;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p);
      local_70._M_head_impl._0_4_ = iVar7;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_60,"result->first","i + 2*N",&ppVar3->first,(int *)&local_70);
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        if (gtest_ar_._0_8_ == 0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)gtest_ar_._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
                   ,0x98,pcVar6);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_70);
        goto LAB_001095ee;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      iVar7 = iVar7 + 1;
    }
    local_70._M_head_impl = local_78;
    local_38.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_60,"check_set.size()","0",(unsigned_long *)&local_70,
               (int *)&local_38);
    if (local_60[0] != (internal)0x0) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      std::
      _Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
                   *)local_a0);
      AddressMap<std::pair<int,_unsigned_long>_>::~AddressMap
                ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p);
      uVar10 = (ulong)(local_d4 + 1);
      goto LAB_00108332;
    }
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar_._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/addressmap_unittest.cc"
               ,0x9a,pcVar6);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_70);
  }
LAB_001095ee:
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if (local_70._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
  pAVar5 = &gtest_ar_;
LAB_0010960a:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)pAVar5);
  std::
  _Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<const_void_*,_int>,_std::pair<const_void_*,_int>,_std::_Identity<std::pair<const_void_*,_int>_>,_std::less<std::pair<const_void_*,_int>_>,_std::allocator<std::pair<const_void_*,_int>_>_>
               *)local_a0);
LAB_00109060:
  AddressMap<std::pair<int,_unsigned_long>_>::~AddressMap
            ((AddressMap<std::pair<int,_unsigned_long>_> *)&res_p);
  goto LAB_0010906c;
}

Assistant:

TEST(AddressMapUnittest, Basic) {
  constexpr int N = 100000;
  constexpr int kIters = 20;
  constexpr int kMaxRealSize = 49;
  // 100Mb to stress not finding previous object (AddressMap's cluster is 1Mb):
  constexpr size_t kMaxSize = 100 << 20;

  std::mt19937 rng(0);

  // generates uniformly distributed size_t in range [0, n)
  auto uniform = [&] (size_t n) -> size_t {
    return std::uniform_int_distribution<size_t>{0, n-1}(rng);
  };

  std::vector<PtrAndSize> ptrs_and_sizes;
  ptrs_and_sizes.reserve(N);
  for (int i = 0; i < N; ++i) {
    size_t s = uniform(kMaxRealSize-1) + 1;
    ptrs_and_sizes.emplace_back(new char[s], s);
  }

  for (int x = 0; x < kIters; ++x) {
    printf("Iteration %d/%d...\n", x, kIters);

    // Permute pointers to get rid of allocation order issues
    std::shuffle(ptrs_and_sizes.begin(), ptrs_and_sizes.end(), rng);

    AddressMap<ValueT> map(malloc, free);
    const ValueT* result;
    const void* res_p;

    // Insert a bunch of entries
    for (int i = 0; i < N; ++i) {
      char* p = ptrs_and_sizes[i].ptr.get();
      ASSERT_FALSE(map.Find(p));
      int offs = uniform(ptrs_and_sizes[i].size);
      ASSERT_FALSE(map.FindInside(&SizeFunc, kMaxSize, p + offs, &res_p));
      map.Insert(p, std::make_pair(i, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i);
      ASSERT_TRUE(result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p));
      ASSERT_EQ(res_p, p);
      ASSERT_EQ(result->first, i);
      map.Insert(p, std::make_pair(i + N, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + N);
    }

    // Delete the even entries
    for (int i = 0; i < N; i += 2) {
      void* p = ptrs_and_sizes[i].ptr.get();
      ValueT removed;
      ASSERT_TRUE(map.FindAndRemove(p, &removed));
      ASSERT_EQ(removed.first, i + N);
    }

    // Lookup the odd entries and adjust them
    for (int i = 1; i < N; i += 2) {
      char* p = ptrs_and_sizes[i].ptr.get();
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + N);
      int offs = uniform(ptrs_and_sizes[i].size);
      ASSERT_TRUE(result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p));
      ASSERT_EQ(res_p, p);
      ASSERT_EQ(result->first, i + N);
      map.Insert(p, std::make_pair(i + 2*N, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + 2*N);
    }

    // Insert even entries back
    for (int i = 0; i < N; i += 2) {
      char* p = ptrs_and_sizes[i].ptr.get();
      int offs = uniform(ptrs_and_sizes[i].size);
      ASSERT_TRUE(!map.FindInside(&SizeFunc, kMaxSize, p + offs, &res_p));
      map.Insert(p, std::make_pair(i + 2*N, ptrs_and_sizes[i].size));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + 2*N);
      ASSERT_TRUE(result = map.FindInside(&SizeFunc, kMaxRealSize, p + offs, &res_p));
      ASSERT_EQ(res_p, p);
      ASSERT_EQ(result->first, i + 2*N);
    }

    // Check all entries
    std::set<std::pair<const void*, int> > check_set;
    map.Iterate([&] (const void* ptr, ValueT* val) {
      check_set.insert(std::make_pair(ptr, val->first));
    });
    ASSERT_EQ(check_set.size(), N);
    for (int i = 0; i < N; ++i) {
      void* p = ptrs_and_sizes[i].ptr.get();
      check_set.erase(std::make_pair(p, i + 2*N));
      ASSERT_TRUE(result = map.Find(p));
      ASSERT_EQ(result->first, i + 2*N);
    }
    ASSERT_EQ(check_set.size(), 0);
  }
}